

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O2

aom_codec_err_t
aom_codec_enc_init_ver
          (aom_codec_ctx_t *ctx,aom_codec_iface_t *iface,aom_codec_enc_cfg_t *cfg,
          aom_codec_flags_t flags,int ver)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  char *pcVar3;
  
  if ((ver & 0xfffffffbU) == 0x19) {
    if (cfg != (aom_codec_enc_cfg_t *)0x0 &&
        (iface != (aom_codec_iface_t *)0x0 && ctx != (aom_codec_ctx_t *)0x0)) {
      if (iface->abi_version == 7) {
        aVar2 = AOM_CODEC_INCAPABLE;
        if (((iface->caps & 2U) != 0) &&
           (uVar1 = (uint)iface->caps,
           ((byte)((ulong)flags >> 0x10) & (uVar1 >> 0x10 & 1) == 0) == 0)) {
          if (((uint)flags >> 0x12 & 1) == 0) {
            if (AOM_BITS_8 < cfg->g_bit_depth) {
              ctx->err_detail = "High bit-depth used without the AOM_CODEC_USE_HIGHBITDEPTH flag.";
              aVar2 = AOM_CODEC_INVALID_PARAM;
              goto LAB_00227896;
            }
          }
          else if ((uVar1 >> 0x12 & 1) == 0) goto LAB_00227896;
          ctx->iface = iface;
          ctx->name = iface->name;
          ctx->priv = (aom_codec_priv_t *)0x0;
          ctx->init_flags = flags;
          (ctx->config).dec = (aom_codec_dec_cfg *)cfg;
          aVar2 = (*iface->init)(ctx);
          if (aVar2 == AOM_CODEC_OK) {
            aVar2 = AOM_CODEC_OK;
          }
          else {
            if (ctx->priv == (aom_codec_priv_t *)0x0) {
              pcVar3 = (char *)0x0;
            }
            else {
              pcVar3 = ctx->priv->err_detail;
            }
            ctx->err_detail = pcVar3;
            aom_codec_destroy(ctx);
          }
        }
      }
      else {
        aVar2 = AOM_CODEC_ABI_MISMATCH;
      }
      goto LAB_00227896;
    }
    aVar2 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    aVar2 = AOM_CODEC_ABI_MISMATCH;
  }
  if (ctx == (aom_codec_ctx_t *)0x0) {
    return aVar2;
  }
LAB_00227896:
  ctx->err = aVar2;
  return aVar2;
}

Assistant:

aom_codec_err_t aom_codec_enc_init_ver(aom_codec_ctx_t *ctx,
                                       aom_codec_iface_t *iface,
                                       const aom_codec_enc_cfg_t *cfg,
                                       aom_codec_flags_t flags, int ver) {
  aom_codec_err_t res;
  // The value of AOM_ENCODER_ABI_VERSION in libaom v3.0.0 and v3.1.0 - v3.1.3.
  //
  // We are compatible with these older libaom releases. AOM_ENCODER_ABI_VERSION
  // was incremented after these releases for two reasons:
  // 1. AOM_ENCODER_ABI_VERSION takes contribution from
  //    AOM_EXT_PART_ABI_VERSION. The external partition API is still
  //    experimental, so it should not be considered as part of the stable ABI.
  //    fd9ed8366 External partition: Define APIs
  //    https://aomedia-review.googlesource.com/c/aom/+/135663
  // 2. As a way to detect the presence of speeds 7-9 in all-intra mode. I (wtc)
  //    suggested this change because I misunderstood how
  //    AOM_ENCODER_ABI_VERSION was used.
  //    bbdfa68d1 AllIntra: Redefine all-intra mode speed features for speed 7+
  //    https://aomedia-review.googlesource.com/c/aom/+/140624
  const int aom_encoder_abi_version_25 = 25;

  // TODO(bug aomedia:3228): Remove the check for aom_encoder_abi_version_25 in
  // libaom v4.0.0.
  if (ver != AOM_ENCODER_ABI_VERSION && ver != aom_encoder_abi_version_25)
    res = AOM_CODEC_ABI_MISMATCH;
  else if (!ctx || !iface || !cfg)
    res = AOM_CODEC_INVALID_PARAM;
  else if (iface->abi_version != AOM_CODEC_INTERNAL_ABI_VERSION)
    res = AOM_CODEC_ABI_MISMATCH;
  else if (!(iface->caps & AOM_CODEC_CAP_ENCODER))
    res = AOM_CODEC_INCAPABLE;
  else if ((flags & AOM_CODEC_USE_PSNR) && !(iface->caps & AOM_CODEC_CAP_PSNR))
    res = AOM_CODEC_INCAPABLE;
  else if ((flags & AOM_CODEC_USE_HIGHBITDEPTH) &&
           !(iface->caps & AOM_CODEC_CAP_HIGHBITDEPTH)) {
    res = AOM_CODEC_INCAPABLE;
  } else if (cfg->g_bit_depth > 8 &&
             (flags & AOM_CODEC_USE_HIGHBITDEPTH) == 0) {
    res = AOM_CODEC_INVALID_PARAM;
    ctx->err_detail =
        "High bit-depth used without the AOM_CODEC_USE_HIGHBITDEPTH flag.";
  } else {
    ctx->iface = iface;
    ctx->name = iface->name;
    ctx->priv = NULL;
    ctx->init_flags = flags;
    ctx->config.enc = cfg;
    res = ctx->iface->init(ctx);

    if (res) {
      // IMPORTANT: ctx->priv->err_detail must be null or point to a string
      // that remains valid after ctx->priv is destroyed, such as a C string
      // literal. This makes it safe to call aom_codec_error_detail() after
      // aom_codec_enc_init_ver() failed.
      ctx->err_detail = ctx->priv ? ctx->priv->err_detail : NULL;
      aom_codec_destroy(ctx);
    }
  }

  return SAVE_STATUS(ctx, res);
}